

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::Anytest_TreatAsSet_Test::TestBody(Anytest_TreatAsSet_Test *this)

{
  RepeatedPtrField<google::protobuf::Any> *pRVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>_> *pVVar2;
  FieldDescriptor *field;
  char *in_R9;
  AssertHelper local_340;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  string local_330;
  AssertionResult gtest_ar_;
  TestAny m1;
  TestField local_2b8;
  TestField local_260;
  TestAny m2;
  MessageDifferencer message_differencer;
  
  proto2_unittest::TestField::TestField(&local_260);
  proto2_unittest::TestField::TestField(&local_2b8);
  local_260.field_0._60_8_ = 0x1e00000014;
  local_260.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_260.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xc;
  local_2b8.field_0._60_8_ = 0x1f00000014;
  local_2b8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2b8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xc;
  proto2_unittest::TestAny::TestAny(&m1);
  proto2_unittest::TestAny::TestAny(&m2);
  pRVar1 = &m1.field_0._impl_.repeated_any_value_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  Any::PackFrom(pVVar2,&local_260.super_Message);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  Any::PackFrom(pVVar2,&local_2b8.super_Message);
  pRVar1 = &m2.field_0._impl_.repeated_any_value_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  Any::PackFrom(pVVar2,&local_2b8.super_Message);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  Any::PackFrom(pVVar2,&local_260.super_Message);
  util::MessageDifferencer::MessageDifferencer(&message_differencer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"repeated_any_value",(allocator<char> *)&gtest_ar_);
  field = GetFieldDescriptor(&m1.super_Message,&local_330);
  util::MessageDifferencer::TreatAsSet(&message_differencer,field);
  std::__cxx11::string::~string((string *)&local_330);
  gtest_ar_.success_ =
       util::MessageDifferencer::Compare(&message_differencer,&m1.super_Message,&m2.super_Message);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_330,(internal *)&gtest_ar_,
               (AssertionResult *)"message_differencer.Compare(m1, m2)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10dd,local_330._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&local_330);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_338._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_338._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&message_differencer);
  proto2_unittest::TestAny::~TestAny(&m2);
  proto2_unittest::TestAny::~TestAny(&m1);
  proto2_unittest::TestField::~TestField(&local_2b8);
  proto2_unittest::TestField::~TestField(&local_260);
  return;
}

Assistant:

TEST(Anytest, TreatAsSet) {
  proto2_unittest::TestField value1, value2;
  value1.set_a(20);
  value1.set_b(30);
  value2.set_a(20);
  value2.set_b(31);

  proto2_unittest::TestAny m1, m2;
  m1.add_repeated_any_value()->PackFrom(value1);
  m1.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value1);

  util::MessageDifferencer message_differencer;
  message_differencer.TreatAsSet(GetFieldDescriptor(m1, "repeated_any_value"));
  EXPECT_TRUE(message_differencer.Compare(m1, m2));
}